

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

int __thiscall CTcUnasSrcCodeBody::next_byte(CTcUnasSrcCodeBody *this,char *ch)

{
  ulong uVar1;
  
  uVar1 = this->cur_ofs_;
  if (uVar1 < this->end_ofs_) {
    *ch = (this->str_->super_CTcDataStream).pages_[uVar1 / 65000][uVar1 % 65000];
    this->cur_ofs_ = this->cur_ofs_ + 1;
    return 0;
  }
  return 1;
}

Assistant:

int next_byte(char *ch)
    {
        /* if there's anything left, return it */
        if (cur_ofs_ < end_ofs_)
        {
            /* return the next byte */
            *ch = str_->get_byte_at(cur_ofs_);
            ++cur_ofs_;
            return 0;
        }
        else
        {
            /* indicate end of file */
            return 1;
        }
    }